

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O1

void cl_send_cb(uv_udp_send_t *req,int status)

{
  int iVar1;
  uv_handle_t *handle;
  undefined8 *extraout_RDX;
  undefined4 in_register_00000034;
  code *pcVar2;
  uv_udp_send_t *handle_00;
  int in_R8D;
  
  pcVar2 = (code *)CONCAT44(in_register_00000034,status);
  if (req == (uv_udp_send_t *)0x0) {
    cl_send_cb_cold_4();
LAB_00187df7:
    cl_send_cb_cold_1();
LAB_00187dfc:
    cl_send_cb_cold_2();
  }
  else {
    if (status != 0) goto LAB_00187df7;
    req = (uv_udp_send_t *)req->handle;
    if (req != (uv_udp_send_t *)&client && req != (uv_udp_send_t *)&server) goto LAB_00187dfc;
    pcVar2 = alloc_cb;
    iVar1 = uv_udp_recv_start((uv_udp_t *)req,alloc_cb,cl_recv_cb);
    if (iVar1 == 0) {
      cl_send_cb_called = cl_send_cb_called + 1;
      return;
    }
  }
  cl_send_cb_cold_3();
  if (req == (uv_udp_send_t *)0x0) {
    sv_send_cb_cold_3();
    handle_00 = req;
LAB_00187e56:
    sv_send_cb_cold_1();
  }
  else {
    handle_00 = req;
    if ((int)pcVar2 != 0) goto LAB_00187e56;
    handle_00 = (uv_udp_send_t *)req->handle;
    if (handle_00 == (uv_udp_send_t *)&client || handle_00 == (uv_udp_send_t *)&server) {
      uv_close((uv_handle_t *)handle_00,close_cb);
      free(req);
      sv_send_cb_called = sv_send_cb_called + 1;
      return;
    }
  }
  sv_send_cb_cold_2();
  handle = (uv_handle_t *)
           CONCAT71(0x5a99,handle_00 == (uv_udp_send_t *)&client ||
                           handle_00 == (uv_udp_send_t *)&server);
  if (handle_00 == (uv_udp_send_t *)&client || handle_00 == (uv_udp_send_t *)&server) {
    iVar1 = uv_is_closing((uv_handle_t *)handle_00);
    if (iVar1 == 1) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  if (handle_00 == (uv_udp_send_t *)&client || handle_00 == (uv_udp_send_t *)&server) {
    if (in_R8D != 0) goto LAB_00187efd;
    if ((long)pcVar2 < 0) goto LAB_00187f02;
    if (pcVar2 == (code *)0x0) {
      if (handle == (uv_handle_t *)0x0) {
        return;
      }
      goto LAB_00187f16;
    }
    if (handle == (uv_handle_t *)0x0) goto LAB_00187f07;
    if (pcVar2 != (code *)0x4) goto LAB_00187f0c;
    if (*(int *)*extraout_RDX == 0x474e4f50) {
      cl_recv_cb_called = cl_recv_cb_called + 1;
      uv_close((uv_handle_t *)handle_00,close_cb);
      return;
    }
  }
  else {
    cl_recv_cb_cold_1();
LAB_00187efd:
    cl_recv_cb_cold_2();
LAB_00187f02:
    cl_recv_cb_cold_7();
LAB_00187f07:
    cl_recv_cb_cold_5();
LAB_00187f0c:
    cl_recv_cb_cold_3();
  }
  cl_recv_cb_cold_4();
LAB_00187f16:
  cl_recv_cb_cold_6();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void cl_send_cb(uv_udp_send_t* req, int status) {
  int r;

  ASSERT_NOT_NULL(req);
  ASSERT(status == 0);
  CHECK_HANDLE(req->handle);

  r = uv_udp_recv_start(req->handle, cl_alloc_cb, cl_recv_cb);
  ASSERT(r == 0);

  cl_send_cb_called++;
}